

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O0

void __thiscall PixelToaster::UnixDisplay::defaults(UnixDisplay *this)

{
  Format local_14;
  UnixDisplay *pUStack_10;
  Format destFormat_;
  UnixDisplay *this_local;
  
  pUStack_10 = this;
  DisplayAdapter::defaults(&this->super_DisplayAdapter);
  this->display_ = (Display *)0x0;
  this->window_ = 0;
  this->gc_ = (GC)0x0;
  this->image_ = (XImage *)0x0;
  DirtyVector<char>::reset(&this->buffer_,0);
  this->trueColorConverter_ = (Converter *)0x0;
  this->floatingPointConverter_ = (Converter *)0x0;
  this->isShuttingDown_ = false;
  Format::Format(&local_14,Unknown);
  return;
}

Assistant:

void defaults() override
    {
        DisplayAdapter::defaults();

        display_ = 0;
        window_  = 0;
        gc_      = 0;
        image_   = 0;
        buffer_.reset();
        trueColorConverter_     = 0;
        floatingPointConverter_ = 0;
        isShuttingDown_         = false;
        Format destFormat_      = Format::Unknown;
    }